

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void ObsGetHandCard(pyhanabi_observation_t *observation,int pid,int index,pyhanabi_card_t *card)

{
  int iVar1;
  const_reference this;
  int *in_RCX;
  long *in_RDI;
  HanabiCard hanabi_card;
  size_type in_stack_ffffffffffffffd8;
  HanabiCard in_stack_ffffffffffffffe0;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x299,
                  "void ObsGetHandCard(pyhanabi_observation_t *, int, int, pyhanabi_card_t *)");
  }
  if (*in_RDI != 0) {
    if (in_RCX != (int *)0x0) {
      hanabi_learning_env::HanabiObservation::Hands((HanabiObservation *)*in_RDI);
      this = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::at((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                   *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      hanabi_learning_env::HanabiHand::Cards(this);
      std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
      ::at((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
            *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      iVar1 = hanabi_learning_env::HanabiCard::Color((HanabiCard *)&stack0xffffffffffffffe0);
      *in_RCX = iVar1;
      iVar1 = hanabi_learning_env::HanabiCard::Rank((HanabiCard *)&stack0xffffffffffffffe0);
      in_RCX[1] = iVar1;
      return;
    }
    __assert_fail("card != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x29b,
                  "void ObsGetHandCard(pyhanabi_observation_t *, int, int, pyhanabi_card_t *)");
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x29a,"void ObsGetHandCard(pyhanabi_observation_t *, int, int, pyhanabi_card_t *)")
  ;
}

Assistant:

void ObsGetHandCard(pyhanabi_observation_t* observation, int pid, int index,
                    pyhanabi_card_t* card) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(card != nullptr);
  hanabi_learning_env::HanabiCard hanabi_card =
      reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
          observation->observation)
          ->Hands()
          .at(pid)
          .Cards()
          .at(index);
  card->color = hanabi_card.Color();
  card->rank = hanabi_card.Rank();
}